

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O0

bool Omega_h::any_cast<bool>(any *operand)

{
  bool *pbVar1;
  bad_any_cast *this;
  bool *p;
  any *operand_local;
  
  pbVar1 = any_cast<bool>(operand);
  if (pbVar1 == (bool *)0x0) {
    this = (bad_any_cast *)__cxa_allocate_exception(8);
    memset(this,0,8);
    bad_any_cast::bad_any_cast(this);
    __cxa_throw(this,&bad_any_cast::typeinfo,bad_any_cast::~bad_any_cast);
  }
  return (bool)(*pbVar1 & 1);
}

Assistant:

inline ValueType any_cast(any& operand) {
  auto p = any_cast<typename std::remove_reference<ValueType>::type>(&operand);
  if (p == nullptr) throw bad_any_cast();
  return *p;
}